

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf_mod.c
# Opt level: O0

int module_init(CONF_MODULE *pmod,char *name,char *value,CONF *cnf)

{
  int iVar1;
  CONF_IMODULE *ptr;
  char *pcVar2;
  CONF *in_RCX;
  char *in_RDX;
  char *in_RSI;
  CONF_MODULE *in_RDI;
  CONF_IMODULE *imod;
  int init_called;
  int ret;
  int iVar3;
  int iVar4;
  int line;
  
  iVar4 = 1;
  iVar3 = 0;
  ptr = (CONF_IMODULE *)CRYPTO_malloc(0x28,"crypto/conf/conf_mod.c",0x169);
  if (ptr != (CONF_IMODULE *)0x0) {
    ptr->pmod = in_RDI;
    pcVar2 = CRYPTO_strdup(in_RSI,"crypto/conf/conf_mod.c",0x16e);
    ptr->name = pcVar2;
    pcVar2 = CRYPTO_strdup(in_RDX,"crypto/conf/conf_mod.c",0x16f);
    ptr->value = pcVar2;
    ptr->usr_data = (void *)0x0;
    if ((ptr->name == (char *)0x0) || (ptr->value == (char *)0x0)) goto LAB_003aab30;
    if (in_RDI->init != (conf_init_func *)0x0) {
      iVar4 = (*in_RDI->init)(ptr,in_RCX);
      iVar3 = 1;
      if (iVar4 < 1) goto LAB_003aab0c;
    }
    line = (int)((ulong)in_RCX >> 0x20);
    if ((initialized_modules == (stack_st_CONF_IMODULE *)0x0) &&
       (initialized_modules = sk_CONF_IMODULE_new_null(),
       initialized_modules == (stack_st_CONF_IMODULE *)0x0)) {
      ERR_new();
      ERR_set_debug(in_RDX,line,(char *)CONCAT44(iVar4,iVar3));
      ERR_set_error(0xe,0xc0100,(char *)0x0);
    }
    else {
      iVar1 = sk_CONF_IMODULE_push((stack_st_CONF_IMODULE *)CONCAT44(iVar4,iVar3),ptr);
      if (iVar1 != 0) {
        in_RDI->links = in_RDI->links + 1;
        return iVar4;
      }
      ERR_new();
      ERR_set_debug(in_RDX,line,(char *)CONCAT44(iVar4,iVar3));
      ERR_set_error(0xe,0xc0100,(char *)0x0);
    }
  }
LAB_003aab0c:
  if ((in_RDI->finish != (conf_finish_func *)0x0) && (iVar3 != 0)) {
    (*in_RDI->finish)(ptr);
  }
LAB_003aab30:
  if (ptr != (CONF_IMODULE *)0x0) {
    CRYPTO_free(ptr->name);
    CRYPTO_free(ptr->value);
    CRYPTO_free(ptr);
  }
  return -1;
}

Assistant:

static int module_init(CONF_MODULE *pmod, const char *name, const char *value,
                       const CONF *cnf)
{
    int ret = 1;
    int init_called = 0;
    CONF_IMODULE *imod = NULL;

    /* Otherwise add initialized module to list */
    imod = OPENSSL_malloc(sizeof(*imod));
    if (imod == NULL)
        goto err;

    imod->pmod = pmod;
    imod->name = OPENSSL_strdup(name);
    imod->value = OPENSSL_strdup(value);
    imod->usr_data = NULL;

    if (!imod->name || !imod->value)
        goto memerr;

    /* Try to initialize module */
    if (pmod->init) {
        ret = pmod->init(imod, cnf);
        init_called = 1;
        /* Error occurred, exit */
        if (ret <= 0)
            goto err;
    }

    if (initialized_modules == NULL) {
        initialized_modules = sk_CONF_IMODULE_new_null();
        if (!initialized_modules) {
            ERR_raise(ERR_LIB_CONF, ERR_R_MALLOC_FAILURE);
            goto err;
        }
    }

    if (!sk_CONF_IMODULE_push(initialized_modules, imod)) {
        ERR_raise(ERR_LIB_CONF, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    pmod->links++;

    return ret;

 err:

    /* We've started the module so we'd better finish it */
    if (pmod->finish && init_called)
        pmod->finish(imod);

 memerr:
    if (imod) {
        OPENSSL_free(imod->name);
        OPENSSL_free(imod->value);
        OPENSSL_free(imod);
    }

    return -1;

}